

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

void Curl_conncache_close_all_connections(conncache *connc)

{
  Curl_easy **datap;
  Curl_easy *pCVar1;
  connectdata *conn;
  sigpipe_ignore pipe_st;
  char buffer [1025];
  sigpipe_ignore sStack_4c8;
  char local_428 [1032];
  
  pCVar1 = connc->closure_handle;
  if (pCVar1 != (Curl_easy *)0x0) {
    datap = &connc->closure_handle;
    (pCVar1->state).buffer = local_428;
    (pCVar1->set).buffer_size = 0x400;
    conn = conncache_find_first_connection(connc);
    while (conn != (connectdata *)0x0) {
      sigpipe_ignore(*datap,&sStack_4c8);
      Curl_conncontrol(conn,1);
      Curl_conncache_remove_conn(*datap,conn,true);
      Curl_disconnect(*datap,conn,false);
      if (sStack_4c8.no_signal == false) {
        sigaction(0xd,(sigaction *)&sStack_4c8,(sigaction *)0x0);
      }
      conn = conncache_find_first_connection(connc);
    }
    pCVar1 = *datap;
    (pCVar1->state).buffer = (char *)0x0;
    sigpipe_ignore(pCVar1,&sStack_4c8);
    Curl_hostcache_clean(*datap,((*datap)->dns).hostcache);
    Curl_close(datap);
    if (sStack_4c8.no_signal == false) {
      sigaction(0xd,(sigaction *)&sStack_4c8,(sigaction *)0x0);
    }
  }
  return;
}

Assistant:

void Curl_conncache_close_all_connections(struct conncache *connc)
{
  struct connectdata *conn;
  char buffer[READBUFFER_MIN + 1];
  SIGPIPE_VARIABLE(pipe_st);
  if(!connc->closure_handle)
    return;
  connc->closure_handle->state.buffer = buffer;
  connc->closure_handle->set.buffer_size = READBUFFER_MIN;

  conn = conncache_find_first_connection(connc);
  while(conn) {
    sigpipe_ignore(connc->closure_handle, &pipe_st);
    /* This will remove the connection from the cache */
    connclose(conn, "kill all");
    Curl_conncache_remove_conn(connc->closure_handle, conn, TRUE);
    Curl_disconnect(connc->closure_handle, conn, FALSE);
    sigpipe_restore(&pipe_st);

    conn = conncache_find_first_connection(connc);
  }

  connc->closure_handle->state.buffer = NULL;
  sigpipe_ignore(connc->closure_handle, &pipe_st);

  Curl_hostcache_clean(connc->closure_handle,
                       connc->closure_handle->dns.hostcache);
  Curl_close(&connc->closure_handle);
  sigpipe_restore(&pipe_st);
}